

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_ManExtractWindow(void *pMan,Vec_Int_t *vRoots,Vec_Wec_t *vCuts,Vec_Wec_t *vObjCuts,
                       Vec_Int_t *vSolCuts,Vec_Int_t *vCutGates,Vec_Wrd_t *vCutAreas,word *pInvArea,
                       int StartVar,int nVars)

{
  uint uVar1;
  Vec_Wec_t *p_00;
  Gia_Man_t *p_01;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint i_00;
  Nf_Cfg_t NVar7;
  uint c_00;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  Nf_Mat_t *pNVar10;
  Vec_Int_t *pVVar11;
  int aiVar12 [2];
  int *piVar13;
  Mio_Cell2_t *pMVar14;
  Vec_Int_t *p_02;
  bool bVar15;
  Mio_Cell2_t *pC;
  int fCompl;
  Nf_Cfg_t Cfg;
  int iCutLit;
  int fComplF;
  int iFanin;
  int Offset;
  int Info;
  int c_1;
  int k;
  int i;
  Vec_Int_t *vArr;
  int fComplExt;
  int iFuncLit;
  int nFans;
  int *pFans;
  Nf_Mat_t *pM [2];
  int iCutInv [2];
  int *pCutSet;
  int *pCut;
  int iCut;
  Vec_Int_t *vCutOne;
  Vec_Int_t *vObj [2];
  int local_60;
  int local_5c;
  int iObj;
  int c;
  Gia_Obj_t *pObj;
  int LitShift;
  int nInputs;
  Nf_Man_t *p;
  Vec_Int_t *vCutGates_local;
  Vec_Int_t *vSolCuts_local;
  Vec_Wec_t *vObjCuts_local;
  Vec_Wec_t *vCuts_local;
  Vec_Int_t *vRoots_local;
  void *pMan_local;
  
  pMan_local._4_4_ = Gia_ManCiNum(*pMan);
  iVar2 = pMan_local._4_4_ * 2 + 2;
  iVar3 = Gia_ManAndNum(*pMan);
  iVar4 = Gia_ManCiNum(*pMan);
  if (nVars < iVar3 * 2 + iVar4) {
    uVar5 = Gia_ManAndNum(*pMan);
    uVar6 = Gia_ManCiNum(*pMan);
    iVar2 = Gia_ManAndNum(*pMan);
    iVar3 = Gia_ManCiNum(*pMan);
    printf("The number of variables is too large: 2*%d + %d = %d > %d.\n",(ulong)uVar5,(ulong)uVar6,
           (ulong)(uint)(iVar2 * 2 + iVar3),(ulong)(uint)nVars);
    pMan_local._4_4_ = 0;
  }
  else {
    *pInvArea = *(word *)((long)pMan + 0xd0);
    Vec_IntClear(vRoots);
    local_5c = 0;
    while( true ) {
      iVar3 = Vec_IntSize(*(Vec_Int_t **)(*pMan + 0x48));
      bVar15 = false;
      if (local_5c < iVar3) {
        _iObj = Gia_ManCo(*pMan,local_5c);
        bVar15 = _iObj != (Gia_Obj_t *)0x0;
      }
      if (!bVar15) break;
      pGVar9 = Gia_ObjFanin0(_iObj);
      iVar3 = Gia_ObjIsCi(pGVar9);
      if (iVar3 != 0) {
        __assert_fail("!Gia_ObjIsCi(Gia_ObjFanin0(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x89d,
                      "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                     );
      }
      iVar3 = Gia_ObjFaninLit0p(*pMan,_iObj);
      Vec_IntPush(vRoots,iVar3 - iVar2);
      local_5c = local_5c + 1;
    }
    Vec_WecClear(vCuts);
    Vec_WecClear(vObjCuts);
    Vec_IntClear(vSolCuts);
    Vec_IntClear(vCutGates);
    Vec_WrdClear(vCutAreas);
    for (local_60 = 0; local_60 < *(int *)(*pMan + 0x18); local_60 = local_60 + 1) {
      pGVar9 = Gia_ManObj(*pMan,local_60);
      iVar3 = Gia_ObjIsAnd(pGVar9);
      if (iVar3 != 0) {
        memset(&pFans,0,0x10);
        for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
          iVar3 = Nf_ObjMapRefNum((Nf_Man_t *)pMan,local_60,local_5c);
          if (iVar3 != 0) {
            pNVar10 = Nf_ObjMatchBest((Nf_Man_t *)pMan,local_60,local_5c);
            if ((*(uint *)pNVar10 >> 0x1e & 1) == 0) {
              pNVar10 = Nf_ObjMatchBest((Nf_Man_t *)pMan,local_60,local_5c);
              pM[(long)local_5c + -1] = pNVar10;
            }
            else {
              if (iCutInv[(long)local_5c + -2] != -1) {
                __assert_fail("iCutInv[c] == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8b4,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              iVar3 = Vec_IntSize(vSolCuts);
              iCutInv[(long)local_5c + -2] = iVar3;
              Vec_IntPush(vSolCuts,-1);
            }
          }
        }
        iVar3 = Vec_WecSize(vObjCuts);
        if (iVar3 != local_60 * 2 - iVar2) {
          __assert_fail("Vec_WecSize(vObjCuts) == 2*iObj-LitShift",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x8bc,
                        "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                       );
        }
        for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
          pVVar11 = Vec_WecPushLevel(vObjCuts);
          vObj[(long)local_5c + -1] = pVVar11;
          pVVar11 = vObj[(long)local_5c + -1];
          iVar3 = Abc_Var2Lit(local_60,local_5c);
          iVar3 = Abc_Var2Lit(iVar3 - iVar2,1);
          Vec_IntPush(pVVar11,iVar3);
        }
        aiVar12 = (int  [2])Nf_ObjCutSet((Nf_Man_t *)pMan,local_60);
        iCutInv[0] = aiVar12[0];
        iCutInv[1] = aiVar12[1];
        pCut._4_4_ = 0;
        pCutSet = (int *)((long)aiVar12 + 4);
        while (pCut._4_4_ < *(int *)iCutInv) {
          iVar3 = Nf_CutIsTriv(pCutSet,local_60);
          if (iVar3 != 0) {
            __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8c6,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          iVar3 = Nf_CutSize(pCutSet);
          if (**(int **)((long)pMan + 8) < iVar3) {
            __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8c7,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          iVar3 = Nf_CutFunc(pCutSet);
          iVar3 = Abc_Lit2Var(iVar3);
          iVar4 = Vec_WecSize(*(Vec_Wec_t **)((long)pMan + 0x18));
          if (iVar3 < iVar4) {
            piVar13 = Nf_CutLeaves(pCutSet);
            uVar5 = Nf_CutSize(pCutSet);
            iVar3 = Nf_CutFunc(pCutSet);
            uVar6 = Abc_LitIsCompl(iVar3);
            p_00 = *(Vec_Wec_t **)((long)pMan + 0x18);
            iVar3 = Abc_Lit2Var(iVar3);
            pVVar11 = Vec_WecEntry(p_00,iVar3);
            for (c_1 = 0; iVar3 = Vec_IntSize(pVVar11), c_1 + 1 < iVar3; c_1 = c_1 + 2) {
              i_00 = Vec_IntEntry(pVVar11,c_1);
              iVar3 = Vec_IntEntry(pVVar11,c_1 + 1);
              NVar7 = Nf_Int2Cfg(iVar3);
              c_00 = (uint)NVar7 & 1 ^ uVar6;
              pMVar14 = Nf_ManCell((Nf_Man_t *)pMan,i_00);
              if (uVar5 != *(uint *)&pMVar14->field_0x10 >> 0x1c) {
                __assert_fail("nFans == (int)pC->nFanins",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8d5,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              Vec_IntPush(vCutGates,i_00);
              Vec_WrdPush(vCutAreas,pMVar14->AreaW);
              NVar7 = (Nf_Cfg_t)((uint)NVar7 & 0xfffffffe);
              for (Offset = 0; Offset < 2; Offset = Offset + 1) {
                if (((pM[(long)Offset + -1] != (Nf_Mat_t *)0x0) &&
                    (uVar1 = *(uint *)pM[(long)Offset + -1],
                    uVar8 = Nf_CutHandle((int *)iCutInv,pCutSet), (uVar1 >> 0x14 & 0x3ff) == uVar8))
                   && ((*(uint *)pM[(long)Offset + -1] & 0xfffff) == i_00)) {
                  iVar3 = Nf_Cfg2Int(pM[(long)Offset + -1]->Cfg);
                  iVar4 = Nf_Cfg2Int(NVar7);
                  if (iVar3 == iVar4) {
                    iVar3 = Vec_WecSize(vCuts);
                    Vec_IntPush(vSolCuts,iVar3);
                  }
                }
              }
              iVar3 = Vec_WecSize(vCuts);
              iVar3 = Abc_Var2Lit(StartVar + iVar3,0);
              p_02 = Vec_WecPushLevel(vCuts);
              iVar4 = Abc_Var2Lit(local_60,c_00);
              Vec_IntPush(p_02,iVar4);
              Vec_IntPush(vObj[(long)(int)c_00 + -1],iVar3);
              for (Info = 0; Info < (int)uVar5; Info = Info + 1) {
                iVar3 = Nf_CfgVar(NVar7,Info);
                iVar4 = Nf_CfgCompl(NVar7,Info);
                if (piVar13[iVar3] < pMan_local._4_4_ + 1) {
                  if (iVar4 != 0) {
                    iVar3 = Abc_Var2Lit(piVar13[iVar3],1);
                    Vec_IntPush(p_02,iVar3);
                  }
                }
                else {
                  iVar3 = Abc_Var2Lit(piVar13[iVar3],iVar4);
                  Vec_IntPush(p_02,iVar3);
                }
              }
            }
          }
          pCut._4_4_ = pCut._4_4_ + 1;
          iVar3 = Nf_CutSize(pCutSet);
          pCutSet = pCutSet + (iVar3 + 1);
        }
        for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
          if (iCutInv[(long)local_5c + -2] != -1) {
            iVar3 = iCutInv[(long)local_5c + -2];
            iVar4 = Vec_WecSize(vCuts);
            Vec_IntWriteEntry(vSolCuts,iVar3,iVar4);
          }
          iVar3 = Abc_Var2Lit(local_60,local_5c);
          pVVar11 = Vec_WecEntry(vObjCuts,iVar3 - iVar2);
          iVar3 = Vec_WecSize(vCuts);
          iVar3 = Abc_Var2Lit(StartVar + iVar3,0);
          Vec_IntPush(pVVar11,iVar3);
          pVVar11 = Vec_WecPushLevel(vCuts);
          iVar3 = Abc_Var2Lit(local_60,local_5c);
          Vec_IntPush(pVVar11,iVar3);
          iVar3 = Abc_Var2Lit(local_60,(uint)((local_5c != 0 ^ 0xffU) & 1));
          Vec_IntPush(pVVar11,iVar3);
          Vec_IntPush(vCutGates,3);
          Vec_WrdPush(vCutAreas,*(word *)((long)pMan + 0xd0));
        }
      }
    }
    local_5c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(*(Vec_Int_t **)(*pMan + 0x40));
      bVar15 = false;
      if (local_5c < iVar2) {
        p_01 = *pMan;
        pGVar9 = Gia_ManCi(*pMan,local_5c);
        local_60 = Gia_ObjId(p_01,pGVar9);
        bVar15 = local_60 != 0;
      }
      if (!bVar15) break;
      iVar2 = Nf_ObjMapRefNum((Nf_Man_t *)pMan,local_60,1);
      if (iVar2 != 0) {
        iVar2 = Gia_ManAndNum(*pMan);
        Vec_IntPush(vSolCuts,-(iVar2 * 2 + local_5c));
      }
      local_5c = local_5c + 1;
    }
    iVar2 = Vec_WecSize(vCuts);
    iVar3 = Vec_IntSize(vCutGates);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_IntSize(vCutGates)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90d,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    iVar2 = Vec_WecSize(vCuts);
    iVar3 = Vec_WrdSize(vCutAreas);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90e,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    iVar2 = Vec_WecSize(vObjCuts);
    iVar3 = Gia_ManAndNum(*pMan);
    if (iVar2 != iVar3 * 2) {
      __assert_fail("Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90f,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Nf_ManExtractWindow( void * pMan, Vec_Int_t * vRoots, Vec_Wec_t * vCuts, Vec_Wec_t * vObjCuts, Vec_Int_t * vSolCuts, Vec_Int_t * vCutGates, Vec_Wrd_t * vCutAreas, word * pInvArea, int StartVar, int nVars )
{
    Nf_Man_t * p = (Nf_Man_t *)pMan;
    int nInputs = Gia_ManCiNum(p->pGia);
    int LitShift = 2*nInputs+2;
    Gia_Obj_t * pObj;
    int c, iObj;
    if ( 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia) > nVars )
    {
        printf( "The number of variables is too large: 2*%d + %d = %d > %d.\n", Gia_ManAndNum(p->pGia), Gia_ManCiNum(p->pGia), 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia), nVars );
        return 0;
    }
    *pInvArea = p->InvAreaW;
    // save roots
    Vec_IntClear( vRoots );
    Gia_ManForEachCo( p->pGia, pObj, c )
    {
        assert( !Gia_ObjIsCi(Gia_ObjFanin0(pObj)) );
        Vec_IntPush( vRoots, Gia_ObjFaninLit0p(p->pGia, pObj)-LitShift );
    }
    // prepare
    Vec_WecClear( vCuts );
    Vec_WecClear( vObjCuts );
    Vec_IntClear( vSolCuts );
    Vec_IntClear( vCutGates );
    Vec_WrdClear( vCutAreas );
    // collect cuts for each node
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_Int_t * vObj[2], * vCutOne;
        int iCut, * pCut, * pCutSet;
        int iCutInv[2] = {-1, -1};
        // get matches
        Nf_Mat_t * pM[2] = {NULL, NULL};
        for ( c = 0; c < 2; c++ )
        {
            if ( Nf_ObjMapRefNum(p, iObj, c) == 0 )
                continue;
            if ( Nf_ObjMatchBest(p, iObj, c)->fCompl )
            {
                assert( iCutInv[c] == -1 );
                iCutInv[c] = Vec_IntSize(vSolCuts);
                Vec_IntPush( vSolCuts, -1 );
                continue;
            }
            pM[c] = Nf_ObjMatchBest(p, iObj, c);
        }
        // start collecting cuts of pos-obj and neg-obj
        assert( Vec_WecSize(vObjCuts) == 2*iObj-LitShift );
        for ( c = 0; c < 2; c++ )
        {
            vObj[c] = Vec_WecPushLevel( vObjCuts );
            Vec_IntPush( vObj[c], Abc_Var2Lit(Abc_Var2Lit(iObj, c)-LitShift, 1) );
        }
        // enumerate cuts
        pCutSet = Nf_ObjCutSet( p, iObj );
        Nf_SetForEachCut( pCutSet, pCut, iCut )
        {
            assert( !Nf_CutIsTriv(pCut, iObj) );
            assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
            if ( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) )
            {
                int * pFans      = Nf_CutLeaves(pCut);
                int nFans        = Nf_CutSize(pCut);
                int iFuncLit     = Nf_CutFunc(pCut);
                int fComplExt    = Abc_LitIsCompl(iFuncLit);
                Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
                int i, k, c, Info, Offset, iFanin, fComplF, iCutLit;
                Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
                {
                    Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
                    int fCompl     = Cfg.fCompl ^ fComplExt;
                    Mio_Cell2_t*pC = Nf_ManCell( p, Info );
                    assert( nFans == (int)pC->nFanins );
                    Vec_IntPush( vCutGates, Info );
                    Vec_WrdPush( vCutAreas, pC->AreaW );
                    // to make comparison possible
                    Cfg.fCompl = 0;
                    // add solution cut
                    for ( c = 0; c < 2; c++ )
                    {
                        if ( pM[c] == NULL )
                            continue;
                        if ( (int)pM[c]->CutH == Nf_CutHandle(pCutSet, pCut) && (int)pM[c]->Gate == Info && Nf_Cfg2Int(pM[c]->Cfg) == Nf_Cfg2Int(Cfg) )
                        {
                            Vec_IntPush( vSolCuts, Vec_WecSize(vCuts) );
                            //printf( "adding solution for %d\n", Abc_Var2Lit(iObj, c)-LitShift );
                        }
                    }
                    // add new cut
                    iCutLit = Abc_Var2Lit( StartVar + Vec_WecSize(vCuts), 0 );
                    vCutOne = Vec_WecPushLevel( vCuts );
                    // add literals
                    Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, fCompl) );
                    Vec_IntPush( vObj[fCompl], iCutLit );
                    Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
                        if ( pFans[iFanin] >= nInputs + 1 ) // internal node
                        {
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], fComplF) );
                            //Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(pFans[iFanin], fComplF)-LitShift), iCutLit );
                        }
                        else if ( fComplF ) // complemented primary input
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], 1) );
                } 
            }
        }
        assert( iCutInv[0] == -1 || iCutInv[1] == -1 );
        // add inverter cut
        for ( c = 0; c < 2; c++ )
        {
            if ( iCutInv[c] != -1 )
                Vec_IntWriteEntry( vSolCuts, iCutInv[c], Vec_WecSize(vCuts) );
            // the obj-lit implies its cut
            Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(iObj, c)-LitShift), Abc_Var2Lit(StartVar + Vec_WecSize(vCuts), 0) );
            // the cut includes both literals
            vCutOne = Vec_WecPushLevel( vCuts );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, c) );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, !c) );
            Vec_IntPush( vCutGates, 3 );
            Vec_WrdPush( vCutAreas, p->InvAreaW );
        }
    }
//    for ( c = 0; c < p->nCells; c++ )
//        printf( "%d=%s ", c, p->pCells[c].pName );
//    printf( "\n" );
    // add complemented inputs
    Gia_ManForEachCiId( p->pGia, iObj, c )
        if ( Nf_ObjMapRefNum(p, iObj, 1) )
            Vec_IntPush( vSolCuts, -(2*Gia_ManAndNum(p->pGia)+c) );
    assert( Vec_WecSize(vCuts) == Vec_IntSize(vCutGates) );
    assert( Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas) );
    assert( Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia) );
    return nInputs;
}